

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLFormulasLoader.cpp
# Opt level: O0

INode * __thiscall
COLLADASaxFWL::FormulasLoader::createMultiOperandOperation
          (FormulasLoader *this,NodeVector *nodes,Operator op)

{
  uint in_EDX;
  undefined8 in_RSI;
  long *in_RDI;
  INode *node;
  undefined8 local_20;
  
  if (in_EDX < 4) {
    local_20 = (INode *)(**(code **)(*in_RDI + 0xa08))(in_RDI,in_RSI,in_EDX);
  }
  else if (in_EDX - 5 < 3) {
    local_20 = (INode *)(**(code **)(*in_RDI + 0xa10))(in_RDI,in_RSI,in_EDX);
  }
  else if (in_EDX - 8 < 6) {
    local_20 = (INode *)(**(code **)(*in_RDI + 0xa18))(in_RDI,in_RSI,in_EDX);
  }
  else {
    local_20 = (INode *)0x0;
  }
  return local_20;
}

Assistant:

MathML::AST::INode* FormulasLoader::createMultiOperandOperation( const NodeVector& nodes, Operator op )
	{
		MathML::AST::INode* node;
		switch ( op )
		{
		case ADD:
		case SUB:
		case MUL:
		case DIV:
			node = createArithmeticOperation( nodes, op );
			break;
		case AND:
		case OR:
		case XOR:
			node = createLogicOperation( nodes, op );
			break;
		case EQ:
		case NEQ:
		case LT:
		case LTE:
		case GT:
		case GTE:
			node = createBinaryComparisonOperation( nodes, op );
			break;
		default:
			// invalid operator
			node = 0;
		}

		return node;
	}